

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O3

Gia_Man_t * Unr_ManUnrollSimple(Gia_Man_t *pGia,int nFrames)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *__s;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  Gia_Man_t *p;
  size_t sVar10;
  char *__dest;
  ulong uVar11;
  Gia_Obj_t *pGVar12;
  Gia_Man_t *pGVar13;
  int iVar14;
  Vec_Int_t *pVVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  
  p = Gia_ManStart(10000);
  __s = pGia->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar10 = strlen(__s);
    __dest = (char *)malloc(sVar10 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  Gia_ManHashAlloc(p);
  pGVar4 = pGia->pObjs;
  pGVar4->Value = 0;
  uVar11 = (ulong)pGia->nRegs;
  if (0 < (long)uVar11) {
    pVVar15 = pGia->vCos;
    iVar14 = pVVar15->nSize;
    uVar17 = (ulong)(uint)(iVar14 - pGia->nRegs);
    uVar18 = uVar11;
    do {
      if (((int)uVar17 < 0) || (iVar14 <= (int)uVar17)) {
LAB_0054bd44:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar9 = pVVar15->pArray[uVar17];
      if (((long)iVar9 < 0) || (pGia->nObjs <= iVar9)) {
LAB_0054bd06:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar4[iVar9].Value = 0;
      uVar17 = uVar17 + 1;
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  if (0 < nFrames) {
    iVar14 = 0;
    do {
      pVVar15 = pGia->vCis;
      iVar9 = pVVar15->nSize;
      uVar8 = (uint)uVar11;
      iVar16 = iVar9 - uVar8;
      if (iVar16 != 0 && (int)uVar8 <= iVar9) {
        lVar20 = 0;
        do {
          uVar8 = (uint)uVar11;
          if (iVar9 <= lVar20) goto LAB_0054bd44;
          iVar1 = pVVar15->pArray[lVar20];
          if (((long)iVar1 < 0) || (pGia->nObjs <= iVar1)) goto LAB_0054bd06;
          pGVar4 = pGia->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          pGVar12 = Gia_ManAppendObj(p);
          uVar11 = *(ulong *)pGVar12;
          *(ulong *)pGVar12 = uVar11 | 0x9fffffff;
          *(ulong *)pGVar12 =
               uVar11 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p->pObjs;
          if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) {
LAB_0054bd25:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p->pObjs;
          if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) goto LAB_0054bd25;
          pGVar4[iVar1].Value = (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * 0x55555556;
          lVar20 = lVar20 + 1;
          uVar8 = pGia->nRegs;
          uVar11 = (ulong)uVar8;
          pVVar15 = pGia->vCis;
          iVar9 = pVVar15->nSize;
          iVar16 = iVar9 - uVar8;
        } while (lVar20 < iVar16);
      }
      if ((int)uVar8 < 1) {
        uVar8 = pGia->nObjs;
        if (0 < (int)uVar8) goto LAB_0054bb41;
      }
      else {
        pVVar6 = pGia->vCos;
        iVar1 = pVVar6->nSize;
        uVar19 = iVar1 - uVar8;
        lVar20 = (long)iVar16;
        uVar11 = (ulong)uVar8;
        do {
          if (((int)uVar19 < 0) || (iVar1 <= (int)uVar19)) goto LAB_0054bd44;
          iVar2 = pVVar6->pArray[uVar19];
          if (((long)iVar2 < 0) || (uVar8 = pGia->nObjs, (int)uVar8 <= iVar2)) goto LAB_0054bd06;
          pGVar4 = pGia->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          if ((iVar16 < 0) || (iVar9 <= lVar20)) goto LAB_0054bd44;
          uVar3 = pVVar15->pArray[lVar20];
          if (((long)(int)uVar3 < 0) || (uVar8 <= uVar3)) goto LAB_0054bd06;
          pGVar4[(int)uVar3].Value = pGVar4[iVar2].Value;
          lVar20 = lVar20 + 1;
          uVar19 = uVar19 + 1;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
LAB_0054bb41:
        lVar21 = 8;
        lVar20 = 0;
        do {
          pGVar4 = pGia->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar11 = *(ulong *)((long)pGVar4 + lVar21 + -8);
          if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
            uVar8 = *(uint *)((long)pGVar4 +
                             lVar21 + (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3);
            if (((int)uVar8 < 0) ||
               (uVar19 = *(uint *)((long)pGVar4 +
                                  lVar21 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar19 < 0)) goto LAB_0054bd63;
            iVar9 = Gia_ManHashAnd(p,uVar8 ^ (uint)(uVar11 >> 0x1d) & 1,
                                   uVar19 ^ (uint)(uVar11 >> 0x3d) & 1);
            *(int *)(&pGVar4->field_0x0 + lVar21) = iVar9;
            uVar8 = pGia->nObjs;
          }
          lVar20 = lVar20 + 1;
          lVar21 = lVar21 + 0xc;
        } while (lVar20 < (int)uVar8);
      }
      pVVar15 = pGia->vCos;
      iVar9 = pVVar15->nSize;
      uVar18 = (ulong)iVar9;
      if (0 < (long)uVar18) {
        piVar7 = pVVar15->pArray;
        uVar11 = 0;
        do {
          iVar16 = piVar7[uVar11];
          if (((long)iVar16 < 0) || ((int)uVar8 <= iVar16)) goto LAB_0054bd06;
          if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = pGia->pObjs + iVar16;
          if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0) {
LAB_0054bd63:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf5,"int Abc_LitNotCond(int, int)");
          }
          pGVar4->Value =
               (uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
               pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value;
          uVar11 = uVar11 + 1;
        } while (uVar18 != uVar11);
      }
      uVar11 = (ulong)(uint)pGia->nRegs;
      if (pGia->nRegs < iVar9) {
        lVar20 = 0;
        do {
          if ((int)uVar18 <= lVar20) goto LAB_0054bd44;
          iVar9 = pVVar15->pArray[lVar20];
          if (((long)iVar9 < 0) || (pGia->nObjs <= iVar9)) goto LAB_0054bd06;
          if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
          Gia_ManAppendCo(p,pGia->pObjs[iVar9].Value);
          lVar20 = lVar20 + 1;
          uVar11 = (ulong)(uint)pGia->nRegs;
          pVVar15 = pGia->vCos;
          uVar18 = (ulong)(uint)pVVar15->nSize;
        } while (lVar20 < pVVar15->nSize - pGia->nRegs);
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 != nFrames);
  }
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,0);
  pGVar13 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar13;
}

Assistant:

Gia_Man_t * Unr_ManUnrollSimple( Gia_Man_t * pGia, int nFrames )
{
    Gia_Man_t * pFrames;
    Gia_Obj_t * pObj, * pObjRi;
    int f, i; 
    pFrames = Gia_ManStart( 10000 );
    pFrames->pName = Abc_UtilStrsav( pGia->pName );
    Gia_ManHashAlloc( pFrames );
    Gia_ManConst0(pGia)->Value = 0;
    Gia_ManForEachRi( pGia, pObj, i )
        pObj->Value = 0;
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManForEachPi( pGia, pObj, i )
            pObj->Value = Gia_ManAppendCi(pFrames);
        Gia_ManForEachRiRo( pGia, pObjRi, pObj, i )
            pObj->Value = pObjRi->Value;
        Gia_ManForEachAnd( pGia, pObj, i )
            pObj->Value = Gia_ManHashAnd( pFrames, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( pGia, pObj, i )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        Gia_ManForEachPo( pGia, pObj, i )
            Gia_ManAppendCo( pFrames, pObj->Value );
    }
    Gia_ManHashStop( pFrames );
    Gia_ManSetRegNum( pFrames, 0 );
    pFrames = Gia_ManCleanup( pGia = pFrames );
    Gia_ManStop( pGia );
    return pFrames;
}